

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O2

int Dch_ClassesRefineOneClass(Dch_Cla_t *p,Aig_Obj_t *pReprOld,int fRecursive)

{
  int iVar1;
  Aig_Obj_t **pClass;
  uint __line;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  int iVar7;
  Aig_Obj_t **pClass_00;
  char *__assertion;
  long lVar8;
  bool bVar9;
  
  bVar9 = fRecursive == 0;
  pVVar3 = p->vClassNew;
  iVar7 = 0;
  do {
    p->vClassOld->nSize = 0;
    pVVar3->nSize = 0;
    for (lVar8 = 0; lVar8 < p->pClassSizes[pReprOld->Id]; lVar8 = lVar8 + 1) {
      pAVar4 = p->pId2Class[pReprOld->Id][lVar8];
      if (pAVar4 != (Aig_Obj_t *)0x0) {
        iVar2 = (*p->pFuncNodesAreEqual)(p->pManData,pReprOld,pAVar4);
        Vec_PtrPush((&p->vClassOld)[iVar2 == 0],pAVar4);
      }
    }
    if (p->vClassNew->nSize == 0) {
      iVar2 = 0;
      goto LAB_0072d439;
    }
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vClassNew,0);
    if (p->vClassOld->nSize < 1) {
      __assert_fail("Vec_PtrSize(p->vClassOld) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                    ,0x1cf,"int Dch_ClassesRefineOneClass(Dch_Cla_t *, Aig_Obj_t *, int)");
    }
    if (p->vClassNew->nSize < 1) {
      __assert_fail("Vec_PtrSize(p->vClassNew) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                    ,0x1d0,"int Dch_ClassesRefineOneClass(Dch_Cla_t *, Aig_Obj_t *, int)");
    }
    iVar2 = pReprOld->Id;
    pClass = p->pId2Class[iVar2];
    if (pClass == (Aig_Obj_t **)0x0) {
      __assertion = "pClass != NULL";
      __line = 0x74;
LAB_0072d47a:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                    ,__line,"Aig_Obj_t **Dch_ObjRemoveClass(Dch_Cla_t *, Aig_Obj_t *)");
    }
    p->pId2Class[iVar2] = (Aig_Obj_t **)0x0;
    iVar1 = p->pClassSizes[iVar2];
    if (iVar1 < 2) {
      __assertion = "nSize > 1";
      __line = 0x77;
      goto LAB_0072d47a;
    }
    p->nClasses = p->nClasses + -1;
    p->nLits = (p->nLits - iVar1) + 1;
    p->pClassSizes[iVar2] = 0;
    pClass_00 = pClass;
    for (lVar8 = 0; lVar8 < p->vClassOld->nSize; lVar8 = lVar8 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vClassOld,(int)lVar8);
      *pClass_00 = pAVar5;
      pAVar6 = pReprOld;
      if (lVar8 == 0) {
        pAVar6 = (Aig_Obj_t *)0x0;
      }
      Aig_ObjSetRepr(p->pAig,pAVar5,pAVar6);
      pClass_00 = pClass_00 + 1;
    }
    lVar8 = 0;
    while( true ) {
      iVar2 = p->vClassNew->nSize;
      if (iVar2 <= lVar8) break;
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vClassNew,(int)lVar8);
      pClass_00[lVar8] = pAVar5;
      pAVar6 = pAVar4;
      if (lVar8 == 0) {
        pAVar6 = (Aig_Obj_t *)0x0;
      }
      Aig_ObjSetRepr(p->pAig,pAVar5,pAVar6);
      lVar8 = lVar8 + 1;
    }
    iVar1 = p->vClassOld->nSize;
    if (1 < iVar1) {
      Dch_ObjAddClass(p,pReprOld,pClass,iVar1);
      iVar2 = p->vClassNew->nSize;
    }
    if (1 < iVar2) {
      Dch_ObjAddClass(p,pAVar4,pClass_00,iVar2);
    }
    if ((bVar9) || (pVVar3 = p->vClassNew, pVVar3->nSize < 2)) {
      iVar2 = 1;
LAB_0072d439:
      return iVar2 + iVar7;
    }
    iVar7 = iVar7 + 1;
    bVar9 = false;
    pReprOld = pAVar4;
  } while( true );
}

Assistant:

int Dch_ClassesRefineOneClass( Dch_Cla_t * p, Aig_Obj_t * pReprOld, int fRecursive )
{
    Aig_Obj_t ** pClassOld, ** pClassNew;
    Aig_Obj_t * pObj, * pReprNew;
    int i;

    // split the class
    Vec_PtrClear( p->vClassOld );
    Vec_PtrClear( p->vClassNew );
    Dch_ClassForEachNode( p, pReprOld, pObj, i )
        if ( p->pFuncNodesAreEqual(p->pManData, pReprOld, pObj) )
            Vec_PtrPush( p->vClassOld, pObj );
        else
            Vec_PtrPush( p->vClassNew, pObj );
    // check if splitting happened
    if ( Vec_PtrSize(p->vClassNew) == 0 )
        return 0;

    // get the new representative
    pReprNew = (Aig_Obj_t *)Vec_PtrEntry( p->vClassNew, 0 );
    assert( Vec_PtrSize(p->vClassOld) > 0 );
    assert( Vec_PtrSize(p->vClassNew) > 0 );

    // create old class
    pClassOld = Dch_ObjRemoveClass( p, pReprOld );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassOld, pObj, i )
    {
        pClassOld[i] = pObj;
        Aig_ObjSetRepr( p->pAig, pObj, i? pReprOld : NULL );
    }
    // create new class
    pClassNew = pClassOld + i;
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
    {
        pClassNew[i] = pObj;
        Aig_ObjSetRepr( p->pAig, pObj, i? pReprNew : NULL );
    }

    // put classes back
    if ( Vec_PtrSize(p->vClassOld) > 1 )
        Dch_ObjAddClass( p, pReprOld, pClassOld, Vec_PtrSize(p->vClassOld) );
    if ( Vec_PtrSize(p->vClassNew) > 1 )
        Dch_ObjAddClass( p, pReprNew, pClassNew, Vec_PtrSize(p->vClassNew) );

    // check if the class should be recursively refined
    if ( fRecursive && Vec_PtrSize(p->vClassNew) > 1 )
        return 1 + Dch_ClassesRefineOneClass( p, pReprNew, 1 );
    return 1;
}